

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void crnlib::vector<crnlib::color_selector_details>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  uint in_EDX;
  void *in_RSI;
  void *in_RDI;
  color_selector_details *pDst;
  color_selector_details *pSrc_end;
  color_selector_details *pSrc;
  undefined8 local_30;
  undefined8 local_20;
  
  local_30 = in_RDI;
  for (local_20 = in_RSI; local_20 != (void *)((long)in_RSI + (ulong)in_EDX * 0x104);
      local_20 = (void *)((long)local_20 + 0x104)) {
    memcpy(local_30,local_20,0x104);
    local_30 = (void *)((long)local_30 + 0x104);
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num) {
    T* pSrc = static_cast<T*>(pSrc_void);
    T* const pSrc_end = pSrc + num;
    T* pDst = static_cast<T*>(pDst_void);

    while (pSrc != pSrc_end) {
      // placement new
      new (static_cast<void*>(pDst)) T(*pSrc);
      pSrc->~T();
      ++pSrc;
      ++pDst;
    }
  }